

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void prepare_half_coeffs_2tap_avx2
               (InterpFilterParams *filter_params,int32_t subpel_q4,__m256i *coeffs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int16_t *piVar5;
  undefined1 (*in_RDX) [32];
  uint in_ESI;
  InterpFilterParams *in_RDI;
  undefined1 auVar6 [16];
  __m256i coeffs_1;
  __m256i filter_coeffs;
  __m128i coeffs_8;
  int16_t *filter;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined4 uStack_a8;
  undefined4 local_a4;
  
  piVar5 = av1_get_interp_filter_subpel_kernel(in_RDI,in_ESI & 0xf);
  loadu_int32(piVar5 + 3);
  auVar3._8_8_ = CONCAT44(local_a4,uStack_a8);
  auVar3._0_8_ = uStack_b0;
  auVar3._16_8_ = uStack_b0;
  auVar3._24_8_ = CONCAT44(local_a4,uStack_a8);
  auVar3 = vpsraw_avx2(auVar3,ZEXT416(1));
  auVar1 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar1 = vpinsrw_avx(auVar1,0x200,2);
  auVar1 = vpinsrw_avx(auVar1,0x200,3);
  auVar1 = vpinsrw_avx(auVar1,0x200,4);
  auVar1 = vpinsrw_avx(auVar1,0x200,5);
  auVar1 = vpinsrw_avx(auVar1,0x200,6);
  auVar1 = vpinsrw_avx(auVar1,0x200,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar2 = vpinsrw_avx(auVar2,0x200,2);
  auVar2 = vpinsrw_avx(auVar2,0x200,3);
  auVar2 = vpinsrw_avx(auVar2,0x200,4);
  auVar2 = vpinsrw_avx(auVar2,0x200,5);
  auVar2 = vpinsrw_avx(auVar2,0x200,6);
  auVar2 = vpinsrw_avx(auVar2,0x200,7);
  auVar6 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  uStack_f0 = auVar6._0_8_;
  uStack_e8 = auVar6._8_8_;
  auVar4._16_8_ = uStack_f0;
  auVar4._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  auVar4._24_8_ = uStack_e8;
  auVar3 = vpshufb_avx2(auVar3,auVar4);
  *in_RDX = auVar3;
  return;
}

Assistant:

static inline void prepare_half_coeffs_2tap_avx2(
    const InterpFilterParams *const filter_params, const int32_t subpel_q4,
    __m256i *const coeffs /* [1] */) {
  const int16_t *const filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_q4 & SUBPEL_MASK);
  const __m128i coeffs_8 = _mm_cvtsi32_si128(loadu_int32(filter + 3));
  const __m256i filter_coeffs = _mm256_broadcastsi128_si256(coeffs_8);

  // right shift all filter co-efficients by 1 to reduce the bits required.
  // This extra right shift will be taken care of at the end while rounding
  // the result.
  // Since all filter co-efficients are even, this change will not affect the
  // end result
  assert(_mm_test_all_zeros(_mm_and_si128(coeffs_8, _mm_set1_epi16(1)),
                            _mm_set1_epi16((short)0xffff)));

  const __m256i coeffs_1 = _mm256_srai_epi16(filter_coeffs, 1);

  // coeffs 3 4 3 4 3 4 3 4
  *coeffs = _mm256_shuffle_epi8(coeffs_1, _mm256_set1_epi16(0x0200u));
}